

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_float16 * rf_mat_to_float16(rf_mat mat)

{
  rf_float16 *in_RDI;
  float in_stack_00000008;
  float in_stack_0000000c;
  rf_float16 *buffer;
  
  memset(in_RDI,0,0x40);
  in_RDI->v[0] = in_stack_00000008;
  in_RDI->v[1] = mat.m8;
  in_RDI->v[2] = mat.m9;
  in_RDI->v[3] = mat.m10;
  in_RDI->v[4] = in_stack_0000000c;
  in_RDI->v[5] = mat.m12;
  in_RDI->v[6] = mat.m13;
  in_RDI->v[7] = mat.m14;
  in_RDI->v[8] = mat.m0;
  in_RDI->v[9] = mat.m1;
  in_RDI->v[10] = mat.m2;
  in_RDI->v[0xb] = mat.m3;
  in_RDI->v[0xc] = mat.m4;
  in_RDI->v[0xd] = mat.m5;
  in_RDI->v[0xe] = mat.m6;
  in_RDI->v[0xf] = mat.m7;
  return in_RDI;
}

Assistant:

RF_API rf_float16 rf_mat_to_float16(rf_mat mat)
{
    rf_float16 buffer = {0};

    buffer.v[0] = mat.m0;
    buffer.v[1] = mat.m1;
    buffer.v[2] = mat.m2;
    buffer.v[3] = mat.m3;
    buffer.v[4] = mat.m4;
    buffer.v[5] = mat.m5;
    buffer.v[6] = mat.m6;
    buffer.v[7] = mat.m7;
    buffer.v[8] = mat.m8;
    buffer.v[9] = mat.m9;
    buffer.v[10] = mat.m10;
    buffer.v[11] = mat.m11;
    buffer.v[12] = mat.m12;
    buffer.v[13] = mat.m13;
    buffer.v[14] = mat.m14;
    buffer.v[15] = mat.m15;

    return buffer;
}